

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall
Lowerer::GenerateMemInit
          (Lowerer *this,RegOpnd *opnd,int32 offset,uint32 value,Instr *insertBeforeInstr,
          bool isZeroed)

{
  Func *func;
  IRType type;
  IndirOpnd *dst;
  IntConstOpnd *src;
  undefined3 in_register_00000089;
  
  type = TyUint32;
  if (CONCAT31(in_register_00000089,isZeroed) != 0) {
    if (value == 0) {
      return;
    }
    if (value < 0x10000) {
      type = TyUint16 - (value < 0x100);
    }
  }
  func = this->m_func;
  dst = IR::IndirOpnd::New(opnd,offset,type,func,false);
  src = IR::IntConstOpnd::New((ulong)value,type,func,false);
  InsertMove(&dst->super_Opnd,&src->super_Opnd,insertBeforeInstr,true);
  return;
}

Assistant:

void
Lowerer::GenerateMemInit(IR::RegOpnd * opnd, int32 offset, uint32 value, IR::Instr * insertBeforeInstr, bool isZeroed)
{
    IRType type = TyUint32;
    if (isZeroed)
    {
        if (value == 0)
        {
            // Recycler memory are zero initialized
            return;
        }

        if (value <= USHORT_MAX)
        {
            // Recycler memory are zero initialized, so we can just initialize the 8 or 16 bits of value
            type = (value <= UCHAR_MAX)? TyUint8 : TyUint16;
        }
    }

    Func * func = this->m_func;
    InsertMove(IR::IndirOpnd::New(opnd, offset, type, func), IR::IntConstOpnd::New(value, type, func), insertBeforeInstr);
}